

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::parallel(function<void_()> *f1,function<void_()> *f2)

{
  bool bVar1;
  ParallelThread *pPVar2;
  function<void_()> local_98;
  SmartPointer<GEO::Thread> local_78;
  undefined1 local_69;
  function<void_()> local_68;
  SmartPointer<GEO::Thread> local_38;
  undefined1 local_30 [8];
  ThreadGroup threads;
  function<void_()> *f2_local;
  function<void_()> *f1_local;
  
  threads.
  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)f2;
  bVar1 = Process::is_running_threads();
  if (bVar1) {
    std::function<void_()>::operator()(f1);
    std::function<void_()>::operator()(f2);
  }
  else {
    std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
    vector((vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
            *)local_30);
    pPVar2 = (ParallelThread *)operator_new(0x30);
    local_69 = 1;
    std::function<void_()>::function(&local_68,f1);
    anon_unknown.dwarf_5292d::ParallelThread::ParallelThread(pPVar2,&local_68);
    local_69 = 0;
    SmartPointer<GEO::Thread>::SmartPointer(&local_38,(Thread *)pPVar2);
    std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
    push_back((vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
               *)local_30,&local_38);
    SmartPointer<GEO::Thread>::~SmartPointer(&local_38);
    std::function<void_()>::~function(&local_68);
    pPVar2 = (ParallelThread *)operator_new(0x30);
    std::function<void_()>::function(&local_98,f2);
    anon_unknown.dwarf_5292d::ParallelThread::ParallelThread(pPVar2,&local_98);
    SmartPointer<GEO::Thread>::SmartPointer(&local_78,(Thread *)pPVar2);
    std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
    push_back((vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
               *)local_30,&local_78);
    SmartPointer<GEO::Thread>::~SmartPointer(&local_78);
    std::function<void_()>::~function(&local_98);
    Process::run_threads((ThreadGroup *)local_30);
    std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
    ~vector((vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
             *)local_30);
  }
  return;
}

Assistant:

void parallel(
	std::function<void()> f1,
	std::function<void()> f2
    ) {
        if(Process::is_running_threads()) {
	    f1();
	    f2();
        } else {
            ThreadGroup threads;
	    threads.push_back(new ParallelThread(f1));
	    threads.push_back(new ParallelThread(f2));
            Process::run_threads(threads);
        }
    }